

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::RunContext::runCurrentTest(RunContext *this,string *redirectedCout,string *redirectedCerr)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TestCase *pTVar2;
  pointer pcVar3;
  IStreamingReporter *pIVar4;
  size_t sVar5;
  char *pcVar6;
  pointer pSVar7;
  pointer pSVar8;
  bool _missingAssertions;
  uint uVar9;
  long lVar10;
  long lVar11;
  pointer this_00;
  Counts diff;
  SectionStats testCaseSectionStats;
  SectionInfo testCaseSection;
  Counts local_138;
  size_t local_118;
  size_t sStack_110;
  SectionStats local_108;
  SectionInfo local_80;
  
  pTVar2 = this->m_activeTestCase;
  local_80.name._M_dataplus._M_p = (pointer)&local_80.name.field_2;
  pcVar3 = (pTVar2->super_TestCaseInfo).name._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,pcVar3,pcVar3 + (pTVar2->super_TestCaseInfo).name._M_string_length)
  ;
  paVar1 = &local_80.description.field_2;
  local_80.description._M_string_length = 0;
  local_80.description.field_2._M_local_buf[0] = '\0';
  local_80.lineInfo.file = (pTVar2->super_TestCaseInfo).lineInfo.file;
  local_80.lineInfo.line = (pTVar2->super_TestCaseInfo).lineInfo.line;
  pIVar4 = (this->m_reporter)._M_t.
           super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
           ._M_t.
           super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
           .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl;
  local_80.description._M_dataplus._M_p = (pointer)paVar1;
  (*pIVar4->_vptr_IStreamingReporter[7])(pIVar4,&local_80);
  local_118 = (this->m_totals).assertions.passed;
  sStack_110 = (this->m_totals).assertions.failed;
  sVar5 = (this->m_totals).assertions.failedButOk;
  this->m_shouldReportUnexpected = true;
  local_108._vptr_SectionStats = (_func_int **)(pTVar2->super_TestCaseInfo).lineInfo.file;
  local_108.sectionInfo.name._M_dataplus._M_p = (pointer)(pTVar2->super_TestCaseInfo).lineInfo.line;
  pcVar6 = (this->m_lastAssertionInfo).macroName.m_data;
  if (pcVar6 != (char *)0x0) {
    operator_delete__(pcVar6);
  }
  (this->m_lastAssertionInfo).macroName.m_data = (char *)0x0;
  (this->m_lastAssertionInfo).macroName.m_start = "TEST_CASE";
  (this->m_lastAssertionInfo).macroName.m_size = 9;
  (this->m_lastAssertionInfo).lineInfo.file = (char *)local_108._vptr_SectionStats;
  (this->m_lastAssertionInfo).lineInfo.line = (size_t)local_108.sectionInfo.name._M_dataplus._M_p;
  pcVar6 = (this->m_lastAssertionInfo).capturedExpression.m_data;
  if (pcVar6 != (char *)0x0) {
    operator_delete__(pcVar6);
  }
  (this->m_lastAssertionInfo).capturedExpression.m_start = "";
  (this->m_lastAssertionInfo).capturedExpression.m_size = 0;
  (this->m_lastAssertionInfo).capturedExpression.m_data = (char *)0x0;
  (this->m_lastAssertionInfo).resultDisposition = Normal;
  seedRng((this->m_config).super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr);
  uVar9 = (*((this->m_reporter)._M_t.
             super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
             ._M_t.
             super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
             .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl)->
            _vptr_IStreamingReporter[2])();
  if ((uVar9 & 1) == 0) {
    lVar10 = std::chrono::_V2::system_clock::now();
    invokeActiveTestCase(this);
  }
  else {
    RedirectedStreams::RedirectedStreams
              ((RedirectedStreams *)&local_108,redirectedCout,redirectedCerr);
    lVar10 = std::chrono::_V2::system_clock::now();
    invokeActiveTestCase(this);
    RedirectedStreams::~RedirectedStreams((RedirectedStreams *)&local_108);
  }
  lVar11 = std::chrono::_V2::system_clock::now();
  local_138.passed = (this->m_totals).assertions.passed - local_118;
  local_138.failed = (this->m_totals).assertions.failed - sStack_110;
  local_138.failedButOk = (this->m_totals).assertions.failedButOk - sVar5;
  _missingAssertions = testForMissingAssertions(this,&local_138);
  (*this->m_testCaseTracker->_vptr_ITracker[8])();
  handleUnfinishedSections(this);
  clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::_M_erase_at_end
            (&this->m_messages,
             (this->m_messages).
             super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
             super__Vector_impl_data._M_start);
  pSVar7 = (this->m_messageScopes).
           super__Vector_base<Catch::ScopedMessage,_std::allocator<Catch::ScopedMessage>_>._M_impl.
           super__Vector_impl_data._M_start;
  pSVar8 = (this->m_messageScopes).
           super__Vector_base<Catch::ScopedMessage,_std::allocator<Catch::ScopedMessage>_>._M_impl.
           super__Vector_impl_data._M_finish;
  this_00 = pSVar7;
  if (pSVar8 != pSVar7) {
    do {
      ScopedMessage::~ScopedMessage(this_00);
      this_00 = this_00 + 1;
    } while (this_00 != pSVar8);
    (this->m_messageScopes).
    super__Vector_base<Catch::ScopedMessage,_std::allocator<Catch::ScopedMessage>_>._M_impl.
    super__Vector_impl_data._M_finish = pSVar7;
  }
  SectionStats::SectionStats
            (&local_108,&local_80,&local_138,(double)((ulong)(lVar11 - lVar10) / 1000) / 1000000.0,
             _missingAssertions);
  pIVar4 = (this->m_reporter)._M_t.
           super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
           ._M_t.
           super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
           .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl;
  (*pIVar4->_vptr_IStreamingReporter[0xc])(pIVar4,&local_108);
  SectionStats::~SectionStats(&local_108);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.description._M_dataplus._M_p != paVar1) {
    operator_delete(local_80.description._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.name._M_dataplus._M_p != &local_80.name.field_2) {
    operator_delete(local_80.name._M_dataplus._M_p);
  }
  return;
}

Assistant:

void RunContext::runCurrentTest(std::string & redirectedCout, std::string & redirectedCerr) {
        auto const& testCaseInfo = m_activeTestCase->getTestCaseInfo();
        SectionInfo testCaseSection(testCaseInfo.lineInfo, testCaseInfo.name);
        m_reporter->sectionStarting(testCaseSection);
        Counts prevAssertions = m_totals.assertions;
        double duration = 0;
        m_shouldReportUnexpected = true;
        m_lastAssertionInfo = { "TEST_CASE"_sr, testCaseInfo.lineInfo, StringRef(), ResultDisposition::Normal };

        seedRng(*m_config);

        Timer timer;
        CATCH_TRY {
            if (m_reporter->getPreferences().shouldRedirectStdOut) {
#if !defined(CATCH_CONFIG_EXPERIMENTAL_REDIRECT)
                RedirectedStreams redirectedStreams(redirectedCout, redirectedCerr);

                timer.start();
                invokeActiveTestCase();
#else
                OutputRedirect r(redirectedCout, redirectedCerr);
                timer.start();
                invokeActiveTestCase();
#endif
            }